

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O0

void stprintf(state_t *state,char *format,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined4 local_1038;
  undefined4 local_1034;
  va_list va;
  char local_1018 [8];
  char buffer [4096];
  char *format_local;
  state_t *state_local;
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Qa;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_10e8;
  va[0]._0_8_ = &stack0x00000008;
  local_1034 = 0x30;
  local_1038 = 0x10;
  local_10d8 = in_RDX;
  local_10d0 = in_RCX;
  local_10c8 = in_R8;
  local_10c0 = in_R9;
  buffer._4088_8_ = format;
  vsnprintf(local_1018,0x1000,format,&local_1038);
  pcVar1 = append(state->actual,local_1018);
  state->actual = pcVar1;
  return;
}

Assistant:

static void stprintf(state_t *state, char *format, ...) {
	char buffer[4096];
	va_list va;

	va_start(va, format);
	vsnprintf(buffer, sizeof(buffer), format, va);
	state->actual = append(state->actual, buffer);
	va_end(va);
}